

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O2

PyObject * libxml_longWrap(long val)

{
  PyObject *pPVar1;
  
  pPVar1 = (PyObject *)PyLong_FromLong();
  return pPVar1;
}

Assistant:

PyObject *
libxml_longWrap(long val)
{
    PyObject *ret;

#ifdef DEBUG
    printf("libxml_longWrap: val = %ld\n", val);
#endif
    ret = PyLong_FromLong(val);
    return (ret);
}